

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<VectorWriter,unsigned_int,unsigned_long>
               (VectorWriter *s,uint *args,unsigned_long *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<VectorWriter>(s,*args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata64<VectorWriter>(s,*args_1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}